

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

qsizetype QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>_>
          ::size(type *p)

{
  int iVar1;
  qsizetype qVar2;
  type *in_stack_fffffffffffffff0;
  
  qVar2 = QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>_>
          ::size(in_stack_fffffffffffffff0);
  iVar1 = QConcatenable<ProString>::size((ProString *)0x22feea);
  return qVar2 + iVar1;
}

Assistant:

static qsizetype size(const type &p)
    {
        return QConcatenableEx<A>::size(p.a) + QConcatenableEx<B>::size(p.b);
    }